

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

int MeCab::progress_bar(char *message,size_t current,size_t total)

{
  uint uVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar5._8_4_ = (int)(current >> 0x20);
  auVar5._0_8_ = current;
  auVar5._12_4_ = 0x45300000;
  dVar3 = (auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)current) - 4503599627370496.0);
  auVar6._8_4_ = (int)(total >> 0x20);
  auVar6._0_8_ = total;
  auVar6._12_4_ = 0x45300000;
  dVar4 = (auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)total) - 4503599627370496.0);
  uVar2 = (uint)((dVar3 * 100.0) / dVar4);
  if (progress_bar::prev != uVar2) {
    uVar1 = (uint)((dVar3 * 43.0) / dVar4);
    printf("%s: %3d%% |%.*s%*s| ",message,(ulong)uVar2,(ulong)uVar1,progress_bar::bar,
           (ulong)(0x2b - uVar1),"");
    putchar((uint)(uVar2 != 100) * 3 + 10);
    fflush(_stdout);
  }
  progress_bar::prev = uVar2;
  return 1;
}

Assistant:

int progress_bar(const char* message, size_t current, size_t total) {
  static char bar[] = "###########################################";
  static int scale = sizeof(bar) - 1;
  static int prev = 0;

  int cur_percentage  = static_cast<int>(100.0 * current/total);
  int bar_len = static_cast<int>(1.0 * current*scale/total);

  if (prev != cur_percentage) {
    printf("%s: %3d%% |%.*s%*s| ", message, cur_percentage,
           bar_len, bar, scale - bar_len, "");
    if (cur_percentage == 100)
      printf("\n");
    else
      printf("\r");
    fflush(stdout);
  }

  prev = cur_percentage;

  return 1;
}